

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

RealType __thiscall
OpenMD::EAM::Zhou2005Functional
          (EAM *this,RealType rho,RealType rhoe,RealType rhos,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType F3plus,RealType F3minus,RealType Fe,RealType eta)

{
  reference pvVar1;
  double dVar2;
  double dVar3;
  double local_30;
  double local_28;
  double local_20;
  
  dVar2 = rhoe * 0.85;
  if (dVar2 <= rho) {
    if (((rhoe <= rho) || (local_30 = F3minus, rho < dVar2)) &&
       ((rho < rhoe || (local_30 = F3plus, rhoe * 1.15 <= rho)))) {
      if (rho < rhoe * 1.15) {
        return 0.0;
      }
      dVar2 = pow(rho / rhos,eta);
      dVar2 = log(dVar2);
      dVar3 = pow(rho / rhos,eta);
      return dVar3 * (1.0 - dVar2) * Fe;
    }
    local_20 = rho / rhoe + -1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,0);
    local_28 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,1);
    dVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,2);
    dVar2 = (local_30 * local_20 + *pvVar1) * local_20 + dVar2;
  }
  else {
    local_20 = rho / dVar2 + -1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,0);
    local_28 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,1);
    dVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,2);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,3);
    dVar2 = (*pvVar1 * local_20 + dVar3) * local_20 + dVar2;
  }
  return dVar2 * local_20 + local_28;
}

Assistant:

RealType EAM::Zhou2005Functional(RealType rho, RealType rhoe, RealType rhos,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType F3plus,
                                   RealType F3minus, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rhoe) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3minus));
    } else if (rho >= rhoe && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3plus));
    } else if (rho >= rho0) {
      t          = rho / rhos;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }